

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# laszip_dll.cpp
# Opt level: O2

laszip_I32 laszip_create(laszip_POINTER *pointer)

{
  void *__s;
  
  if (pointer != (laszip_POINTER *)0x0) {
    __s = operator_new(0xac8);
    memset(__s,0,0xa7b);
    *(undefined8 *)((long)__s + 0xa7c) = 0;
    *(undefined8 *)((long)__s + 0xa84) = 0;
    *(undefined8 *)((long)__s + 0xa8c) = 0;
    *(undefined8 *)((long)__s + 0xa94) = 0;
    *(undefined8 *)((long)__s + 0xaa0) = 0;
    *(undefined8 *)((long)__s + 0xaa8) = 0;
    *(undefined8 *)((long)__s + 0xab0) = 0;
    *(undefined8 *)((long)__s + 0xab8) = 0;
    *(undefined8 *)((long)__s + 0xac0) = 0;
    laszip_clean(__s);
    *pointer = __s;
  }
  return (uint)(pointer == (laszip_POINTER *)0x0);
}

Assistant:

LASZIP_API laszip_I32
laszip_create(
    laszip_POINTER*                    pointer
)
{
  if (pointer == 0) return 1;

  try
  {
    laszip_dll_struct* laszip_dll = new laszip_dll_struct;
    if (laszip_dll == 0)
    {
      return 1;
    }

    // zero every field of the laszip_dll struct

    laszip_dll->zero();

    // create the default

    laszip_clean(laszip_dll);

    *pointer = laszip_dll;
  }
  catch (...)
  {
    return 1;
  }

  return 0;
}